

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O3

void nni_lmq_flush(nni_lmq *lmq)

{
  size_t sVar1;
  nni_msg *m;
  
  sVar1 = lmq->lmq_len;
  while (sVar1 != 0) {
    m = lmq->lmq_msgs[lmq->lmq_get];
    lmq->lmq_get = lmq->lmq_get + 1 & lmq->lmq_mask;
    lmq->lmq_len = sVar1 - 1;
    nni_msg_free(m);
    sVar1 = lmq->lmq_len;
  }
  return;
}

Assistant:

void
nni_lmq_flush(nni_lmq *lmq)
{
	while (lmq->lmq_len > 0) {
		nng_msg *msg = lmq->lmq_msgs[lmq->lmq_get++];
		lmq->lmq_get &= lmq->lmq_mask;
		lmq->lmq_len--;
		nni_msg_free(msg);
	}
}